

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksort.c
# Opt level: O2

void fallbackSort(UInt32 *fmap,UInt32 *eclass,UInt32 *bhtab,Int32 nblock,Int32 verb)

{
  uint uVar1;
  UInt32 UVar2;
  byte bVar3;
  int iVar4;
  int *piVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  UInt32 UVar15;
  long lVar16;
  int *piVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  UInt32 *pUVar27;
  uint uVar28;
  long lVar29;
  uint uVar31;
  uint uVar32;
  long local_bd8;
  uint local_bcc;
  int local_bc0;
  uint local_bb0;
  int local_bac;
  int local_ba8;
  int local_ba4;
  uint local_b68 [100];
  Int32 stackLo [100];
  Int32 ftab [257];
  Int32 ftabCopy [256];
  ulong uVar30;
  
  if (3 < verb) {
    fwrite("        bucket sorting ...\n",0x1b,1,_stderr);
  }
  for (lVar7 = 0; lVar7 != 0x101; lVar7 = lVar7 + 1) {
    ftab[lVar7] = 0;
  }
  uVar8 = 0;
  uVar25 = 0;
  if (0 < nblock) {
    uVar25 = (ulong)(uint)nblock;
  }
  for (; uVar25 != uVar8; uVar8 = uVar8 + 1) {
    ftab[*(byte *)((long)eclass + uVar8)] = ftab[*(byte *)((long)eclass + uVar8)] + 1;
  }
  for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
    ftabCopy[lVar7] = ftab[lVar7];
  }
  for (lVar7 = 1; lVar7 != 0x101; lVar7 = lVar7 + 1) {
    ftab[lVar7] = ftab[lVar7] + stackLo[lVar7 + 99];
  }
  for (uVar8 = 0; uVar25 != uVar8; uVar8 = uVar8 + 1) {
    iVar18 = ftab[*(byte *)((long)eclass + uVar8)];
    ftab[*(byte *)((long)eclass + uVar8)] = iVar18 + -1;
    fmap[(long)iVar18 + -1] = (UInt32)uVar8;
  }
  iVar18 = nblock / 0x20;
  if (nblock / 0x20 < -1) {
    iVar18 = -2;
  }
  for (uVar8 = 0; iVar18 + 2 != uVar8; uVar8 = uVar8 + 1) {
    bhtab[uVar8] = 0;
  }
  for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
    bhtab[ftab[lVar7] >> 5] = bhtab[ftab[lVar7] >> 5] | 1 << ((byte)ftab[lVar7] & 0x1f);
  }
  for (iVar18 = 0; iVar18 != 0x40; iVar18 = iVar18 + 2) {
    bhtab[nblock + iVar18 >> 5] =
         bhtab[nblock + iVar18 >> 5] | 1 << ((byte)(nblock + iVar18) & 0x1f);
    iVar11 = nblock + 1 + iVar18;
    bVar3 = (byte)iVar11 & 0x1f;
    bhtab[iVar11 >> 5] = bhtab[iVar11 >> 5] & (-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3);
  }
  uVar8 = 1;
  do {
    if (3 < verb) {
      fprintf(_stderr,"        depth %6d has ",uVar8);
    }
    uVar13 = 0;
    for (uVar9 = 0; uVar25 != uVar9; uVar9 = uVar9 + 1) {
      if ((bhtab[uVar9 >> 5 & 0x7ffffff] >> ((uint)uVar9 & 0x1f) & 1) != 0) {
        uVar13 = uVar9 & 0xffffffff;
      }
      iVar18 = fmap[uVar9] - (int)uVar8;
      eclass[(iVar18 >> 0x1f & nblock) + iVar18] = (UInt32)uVar13;
    }
    local_bcc = 0;
    uVar31 = 0;
LAB_0038e700:
    uVar6 = uVar31 - 1;
    iVar18 = uVar31 - 0x20;
    do {
      iVar11 = iVar18;
      uVar12 = uVar6;
      uVar32 = uVar31;
      uVar19 = 1 << (sbyte)(uVar32 & 0x1f) & bhtab[(int)uVar32 >> 5];
      if ((uVar32 & 0x1f) == 0) break;
      uVar31 = uVar32 + 1;
      uVar6 = uVar12 + 1;
      iVar18 = iVar11 + 1;
    } while (uVar19 != 0);
    if (uVar19 != 0) {
      do {
        uVar32 = uVar12;
        iVar11 = iVar11 + 0x20;
        uVar12 = uVar32 + 0x20;
      } while (bhtab[iVar11 >> 5] == 0xffffffff);
      do {
        uVar32 = uVar32 + 1;
      } while ((bhtab[(int)uVar32 >> 5] >> (uVar32 & 0x1f) & 1) != 0);
    }
    if ((int)uVar32 <= nblock) {
      uVar6 = uVar32 - 1;
      uVar12 = uVar32;
      iVar18 = uVar32 - 0x20;
      do {
        iVar11 = iVar18;
        uVar31 = uVar12;
        uVar19 = uVar6;
        uVar20 = 1 << (sbyte)(uVar31 & 0x1f) & bhtab[(int)uVar31 >> 5];
        if ((uVar31 & 0x1f) == 0) break;
        uVar6 = uVar19 + 1;
        uVar12 = uVar31 + 1;
        iVar18 = iVar11 + 1;
      } while (uVar20 == 0);
      if (uVar20 == 0) {
        do {
          uVar31 = uVar19;
          iVar11 = iVar11 + 0x20;
          uVar19 = uVar31 + 0x20;
        } while (bhtab[iVar11 >> 5] == 0);
        do {
          uVar31 = uVar31 + 1;
        } while ((bhtab[(int)uVar31 >> 5] >> (uVar31 & 0x1f) & 1) == 0);
      }
      if (nblock < (int)uVar31) goto LAB_0038ec5d;
      if ((int)uVar32 < (int)uVar31) {
        stackLo[0] = uVar32 - 1;
        local_b68[0] = uVar31 - 1;
        local_bb0 = 0;
        uVar9 = 1;
LAB_0038e824:
        uVar13 = uVar9 & 0xffffffff;
        while (0 < (int)(uint)uVar13) {
          if (0x62 < uVar13) {
            BZ2_bz__AssertH__fail(0x3ec);
          }
          uVar9 = uVar13 - 1;
          uVar26 = uVar9 & 0xffffffff;
          uVar6 = stackLo[uVar26];
          uVar14 = (ulong)uVar6;
          lVar7 = (long)(int)uVar6;
          uVar12 = local_b68[uVar26];
          if (9 < (int)(uVar12 - uVar6)) {
            local_bb0 = local_bb0 * 0x1dc5 + 1 & 0x7fff;
            uVar19 = uVar6;
            if (((short)(local_bb0 % 3) != 0) && (uVar19 = uVar12, local_bb0 % 3 == 1)) {
              uVar19 = (int)(uVar12 + uVar6) >> 1;
            }
            UVar15 = eclass[fmap[(int)uVar19]];
            uVar30 = uVar14;
            uVar20 = uVar12;
            uVar19 = uVar12;
LAB_0038e9bb:
            lVar10 = (long)(int)uVar20 + 1;
            local_ba4 = (int)uVar14;
            uVar14 = (ulong)local_ba4;
            local_ba8 = local_ba4 - uVar6;
            local_ba4 = -local_ba4;
LAB_0038e9dc:
            uVar28 = (uint)uVar30;
            lVar16 = (long)(int)uVar28;
            lVar22 = lVar16;
            do {
              uVar28 = uVar28 + 1;
              uVar30 = (ulong)uVar28;
              if ((int)uVar20 < lVar22) {
                lVar22 = lVar16;
                if (lVar16 < lVar10) {
                  lVar22 = lVar10;
                }
LAB_0038ea3e:
                iVar18 = (int)lVar22;
                lVar10 = (long)iVar18;
                local_bd8 = (long)(int)uVar19;
                local_bac = uVar12 - uVar19;
                goto LAB_0038ea58;
              }
              uVar1 = fmap[lVar22];
              UVar2 = eclass[uVar1];
              if (UVar2 == UVar15) goto LAB_0038e9ff;
              if (UVar2 != UVar15 && (int)UVar15 <= (int)UVar2) goto LAB_0038ea3e;
              lVar22 = lVar22 + 1;
            } while( true );
          }
          uVar13 = uVar9;
          if (uVar12 != uVar6) {
            lVar10 = (long)(int)uVar12;
            if (3 < (int)(uVar12 - uVar6)) {
              lVar16 = (long)(int)(uVar12 - 4);
              lVar23 = lVar16 << 0x20;
              lVar22 = lVar16 + 4;
              for (; lVar7 <= lVar16; lVar16 = lVar16 + -1) {
                UVar15 = fmap[lVar16];
                uVar6 = eclass[(int)UVar15];
                lVar24 = lVar22;
                lVar29 = lVar23;
                while ((lVar24 <= lVar10 && (eclass[fmap[lVar24]] < uVar6))) {
                  fmap[lVar24 + -4] = fmap[lVar24];
                  lVar29 = lVar29 + 0x400000000;
                  lVar24 = lVar24 + 4;
                }
                *(UInt32 *)((long)fmap + (lVar29 >> 0x1e)) = UVar15;
                lVar23 = lVar23 + -0x100000000;
                lVar22 = lVar22 + -1;
              }
            }
            lVar16 = lVar10 << 0x20;
            lVar22 = lVar10;
            while (lVar23 = lVar22 + -1, lVar7 < lVar22) {
              UVar15 = fmap[lVar23];
              uVar6 = eclass[(int)UVar15];
              lVar24 = lVar16;
              while ((lVar22 <= lVar10 && (eclass[fmap[lVar22]] < uVar6))) {
                fmap[lVar22 + -1] = fmap[lVar22];
                lVar22 = lVar22 + 1;
                lVar24 = lVar24 + 0x100000000;
              }
              *(UInt32 *)((long)fmap + (lVar24 >> 0x1e) + -4) = UVar15;
              lVar16 = lVar16 + -0x100000000;
              lVar22 = lVar23;
            }
          }
        }
        UVar15 = 0xffffffff;
        for (lVar7 = (long)(int)(uVar32 - 1); lVar7 < (int)uVar31; lVar7 = lVar7 + 1) {
          UVar2 = eclass[fmap[lVar7]];
          if (UVar15 != UVar2) {
            bhtab[(int)lVar7 >> 5] = bhtab[(int)lVar7 >> 5] | 1 << ((byte)lVar7 & 0x1f);
            UVar15 = UVar2;
          }
        }
        local_bcc = (local_bcc - uVar32) + 1 + uVar31;
      }
      goto LAB_0038e700;
    }
LAB_0038ec5d:
    if (3 < verb) {
      fprintf(_stderr,"%6d unresolved strings\n",(ulong)local_bcc);
    }
    uVar31 = (int)uVar8 * 2;
    uVar8 = (ulong)uVar31;
    if ((nblock < (int)uVar31) || (local_bcc == 0)) {
      if (3 < verb) {
        fwrite("        reconstructing block ...\n",0x21,1,_stderr);
      }
      iVar18 = 0;
      for (uVar8 = 0; uVar8 != uVar25; uVar8 = uVar8 + 1) {
        lVar7 = (long)iVar18;
        iVar18 = iVar18 + -1;
        piVar5 = ftabCopy + lVar7;
        do {
          piVar17 = piVar5;
          iVar18 = iVar18 + 1;
          piVar5 = piVar17 + 1;
        } while (*piVar17 == 0);
        *piVar17 = *piVar17 + -1;
        *(char *)((long)eclass + (ulong)fmap[uVar8]) = (char)iVar18;
      }
      if (0xff < iVar18) {
        BZ2_bz__AssertH__fail(0x3ed);
        return;
      }
      return;
    }
  } while( true );
LAB_0038e9ff:
  fmap[lVar22] = fmap[uVar14];
  fmap[uVar14] = uVar1;
  uVar14 = uVar14 + 1;
  local_ba8 = local_ba8 + 1;
  local_ba4 = local_ba4 + -1;
  goto LAB_0038e9dc;
LAB_0038ea58:
  lVar16 = (long)(int)uVar20;
  iVar11 = uVar19 - uVar20;
  uVar20 = -uVar20;
  lVar22 = lVar16;
  while( true ) {
    uVar28 = (uint)local_bd8;
    if (lVar22 < lVar10) {
      lVar22 = lVar10 + -1;
      if (lVar16 <= lVar10 + -1) {
        lVar22 = lVar16;
      }
      if ((long)uVar14 <= local_bd8) {
        uVar19 = (uint)uVar14;
        iVar21 = iVar18 - uVar19;
        if ((int)(uVar19 - uVar6) < (int)(iVar18 - uVar19)) {
          iVar21 = uVar19 - uVar6;
        }
        iVar4 = local_ba4 + iVar18;
        if (local_ba8 < local_ba4 + iVar18) {
          iVar4 = local_ba8;
        }
        pUVar27 = fmap;
        for (; 0 < iVar21; iVar21 = iVar21 + -1) {
          UVar15 = pUVar27[lVar7];
          pUVar27[lVar7] = pUVar27[iVar18 - iVar4];
          pUVar27[iVar18 - iVar4] = UVar15;
          pUVar27 = pUVar27 + 1;
        }
        local_bc0 = (int)lVar22;
        local_bc0 = uVar28 - local_bc0;
        iVar21 = uVar12 - uVar28;
        if (local_bc0 <= (int)(uVar12 - uVar28)) {
          iVar21 = local_bc0;
        }
        if (local_bac < iVar11) {
          iVar11 = local_bac;
        }
        pUVar27 = fmap;
        for (; 0 < iVar21; iVar21 = iVar21 + -1) {
          UVar15 = pUVar27[iVar18];
          pUVar27[iVar18] = pUVar27[(long)(int)(uVar12 - iVar11) + 1];
          pUVar27[(long)(int)(uVar12 - iVar11) + 1] = UVar15;
          pUVar27 = pUVar27 + 1;
        }
        uVar20 = uVar6 + ~uVar19 + iVar18;
        uVar28 = (uVar12 - local_bc0) + 1;
        if ((int)(uVar12 - uVar28) < (int)(~uVar19 + iVar18)) {
          local_b68[uVar26] = uVar20;
          uVar6 = uVar28;
          uVar20 = uVar12;
        }
        else {
          stackLo[uVar26] = uVar28;
        }
        uVar12 = (uint)uVar13 & 0x7fffffff;
        stackLo[uVar12] = uVar6;
        local_b68[uVar12] = uVar20;
        uVar9 = uVar13 + 1;
      }
      goto LAB_0038e824;
    }
    uVar1 = fmap[lVar22];
    if (eclass[uVar1] == UVar15) break;
    if ((int)eclass[uVar1] < (int)UVar15) {
      uVar20 = ~uVar20;
      UVar2 = fmap[lVar10];
      fmap[lVar10] = uVar1;
      fmap[lVar22] = UVar2;
      uVar30 = (ulong)(iVar18 + 1);
      uVar19 = uVar28;
      goto LAB_0038e9bb;
    }
    lVar22 = lVar22 + -1;
    uVar20 = uVar20 + 1;
    iVar11 = iVar11 + 1;
  }
  fmap[lVar22] = fmap[local_bd8];
  fmap[local_bd8] = uVar1;
  local_bd8 = local_bd8 + -1;
  uVar20 = ~uVar20;
  local_bac = local_bac + 1;
  uVar19 = uVar19 - 1;
  goto LAB_0038ea58;
}

Assistant:

static
void fallbackSort ( UInt32* fmap, 
                    UInt32* eclass, 
                    UInt32* bhtab,
                    Int32   nblock,
                    Int32   verb )
{
   Int32 ftab[257];
   Int32 ftabCopy[256];
   Int32 H, i, j, k, l, r, cc, cc1;
   Int32 nNotDone;
   Int32 nBhtab;
   UChar* eclass8 = (UChar*)eclass;

   /*--
      Initial 1-char radix sort to generate
      initial fmap and initial BH bits.
   --*/
   if (verb >= 4)
      VPrintf0 ( "        bucket sorting ...\n" );
   for (i = 0; i < 257;    i++) ftab[i] = 0;
   for (i = 0; i < nblock; i++) ftab[eclass8[i]]++;
   for (i = 0; i < 256;    i++) ftabCopy[i] = ftab[i];
   for (i = 1; i < 257;    i++) ftab[i] += ftab[i-1];

   for (i = 0; i < nblock; i++) {
      j = eclass8[i];
      k = ftab[j] - 1;
      ftab[j] = k;
      fmap[k] = i;
   }

   nBhtab = 2 + (nblock / 32);
   for (i = 0; i < nBhtab; i++) bhtab[i] = 0;
   for (i = 0; i < 256; i++) SET_BH(ftab[i]);

   /*--
      Inductively refine the buckets.  Kind-of an
      "exponential radix sort" (!), inspired by the
      Manber-Myers suffix array construction algorithm.
   --*/

   /*-- set sentinel bits for block-end detection --*/
   for (i = 0; i < 32; i++) { 
      SET_BH(nblock + 2*i);
      CLEAR_BH(nblock + 2*i + 1);
   }

   /*-- the log(N) loop --*/
   H = 1;
   while (1) {

      if (verb >= 4) 
         VPrintf1 ( "        depth %6d has ", H );

      j = 0;
      for (i = 0; i < nblock; i++) {
         if (ISSET_BH(i)) j = i;
         k = fmap[i] - H; if (k < 0) k += nblock;
         eclass[k] = j;
      }

      nNotDone = 0;
      r = -1;
      while (1) {

     /*-- find the next non-singleton bucket --*/
         k = r + 1;
         while (ISSET_BH(k) && UNALIGNED_BH(k)) k++;
         if (ISSET_BH(k)) {
            while (WORD_BH(k) == 0xffffffff) k += 32;
            while (ISSET_BH(k)) k++;
         }
         l = k - 1;
         if (l >= nblock) break;
         while (!ISSET_BH(k) && UNALIGNED_BH(k)) k++;
         if (!ISSET_BH(k)) {
            while (WORD_BH(k) == 0x00000000) k += 32;
            while (!ISSET_BH(k)) k++;
         }
         r = k - 1;
         if (r >= nblock) break;

         /*-- now [l, r] bracket current bucket --*/
         if (r > l) {
            nNotDone += (r - l + 1);
            fallbackQSort3 ( fmap, eclass, l, r );

            /*-- scan bucket and generate header bits-- */
            cc = -1;
            for (i = l; i <= r; i++) {
               cc1 = eclass[fmap[i]];
               if (cc != cc1) { SET_BH(i); cc = cc1; };
            }
         }
      }

      if (verb >= 4) 
         VPrintf1 ( "%6d unresolved strings\n", nNotDone );

      H *= 2;
      if (H > nblock || nNotDone == 0) break;
   }

   /*-- 
      Reconstruct the original block in
      eclass8 [0 .. nblock-1], since the
      previous phase destroyed it.
   --*/
   if (verb >= 4)
      VPrintf0 ( "        reconstructing block ...\n" );
   j = 0;
   for (i = 0; i < nblock; i++) {
      while (ftabCopy[j] == 0) j++;
      ftabCopy[j]--;
      eclass8[fmap[i]] = (UChar)j;
   }
   AssertH ( j < 256, 1005 );
}